

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriterTests.cpp
# Opt level: O1

string * readFileAndDelete_abi_cxx11_(string *__return_storage_ptr__,char *fileName)

{
  stringstream written;
  ifstream in;
  stringstream local_3a0 [16];
  undefined1 local_390 [112];
  ios_base local_320 [264];
  undefined1 local_218 [16];
  streambuf local_208 [504];
  
  std::ifstream::ifstream(local_218,fileName,_S_in);
  std::__cxx11::stringstream::stringstream(local_3a0);
  std::ostream::operator<<(local_390,local_208);
  std::ifstream::close();
  remove(fileName);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ios_base::~ios_base(local_320);
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string readFileAndDelete(const char* fileName)
{
    std::ifstream in(fileName, std::ios_base::in);
    std::stringstream written;
    written << in.rdbuf();
    in.close();
    remove(fileName);

    std::string text = written.str();
    return text;
}